

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.h
# Opt level: O0

int nsync_pthread_rwlock_rdlock_(nsync_pthread_rwlock_ *rw)

{
  undefined1 local_20 [8];
  unique_lock<std::mutex> rw_mu;
  nsync_pthread_rwlock_ *rw_local;
  
  rw_mu._8_8_ = rw;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&(*rw)->mu);
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_20);
  while (**(int **)rw_mu._8_8_ == -1) {
    std::condition_variable::wait((unique_lock *)(*(long *)rw_mu._8_8_ + 0x30));
  }
  **(int **)rw_mu._8_8_ = **(int **)rw_mu._8_8_ + 1;
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return 0;
}

Assistant:

static inline int nsync_pthread_rwlock_rdlock_ (nsync_pthread_rwlock_ *rw) {
	std::unique_lock<std::mutex> rw_mu ((*rw)->mu, std::defer_lock);
	rw_mu.lock ();
	while ((*rw)->lock == -1) {
		(*rw)->cv.wait (rw_mu);
	}
	(*rw)->lock++;
	rw_mu.unlock ();
	return (0);
}